

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void __thiscall TestSuite::~TestSuite(TestSuite *this)

{
  long lVar1;
  long lVar2;
  type __d;
  undefined8 uVar3;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  string time_str;
  duration<double,_std::ratio<1L,_1L>_> elapsed;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  cur_time;
  uint64_t in_stack_000001f8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffb8;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffffc0;
  duration<double,_std::ratio<1L,_1L>_> local_18;
  undefined8 local_10;
  
  local_10 = std::chrono::_V2::system_clock::now();
  __d = std::chrono::operator-(in_stack_ffffffffffffffb8,in_RDI);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffffc0,(duration<long,_std::ratio<1L,_1000000000L>_> *)__d.__r);
  std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_18);
  usToString_abi_cxx11_(in_stack_000001f8);
  printf("\x1b[32m%zu\x1b[0m tests passed",in_RDI[1].__d.__r);
  if (in_RDI[2].__d.__r != 0) {
    printf(", \x1b[31m%zu\x1b[0m tests failed",in_RDI[2].__d.__r);
  }
  lVar1 = in_RDI[1].__d.__r;
  lVar2 = in_RDI[2].__d.__r;
  uVar3 = std::__cxx11::string::c_str();
  printf(" out of \x1b[36m%zu\x1b[0m (\x1b[33m%s\x1b[0m)\n",lVar1 + lVar2,uVar3);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)(in_RDI + 3));
  return;
}

Assistant:

~TestSuite() {
        std::chrono::time_point<std::chrono::system_clock> cur_time =
                std::chrono::system_clock::now();;
        std::chrono::duration<double> elapsed = cur_time - startTimeGlobal;
        std::string time_str = usToString
                               ( (uint64_t)(elapsed.count() * 1000000) );

        printf(_CL_GREEN("%zu") " tests passed", cntPass);
        if (cntFail) {
            printf(", " _CL_RED("%zu") " tests failed", cntFail);
        }
        printf(" out of " _CL_CYAN("%zu") " (" _CL_BROWN("%s") ")\n",
               cntPass+cntFail, time_str.c_str());
    }